

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

ssize_t __thiscall QMetaProperty::write(QMetaProperty *this,int __fd,void *__buf,size_t __n)

{
  uint *puVar1;
  StaticMetacallFunction p_Var2;
  QDynamicMetaObjectData *pQVar3;
  bool bVar4;
  QMetaObject *pQVar5;
  undefined8 uVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ssize_t sVar7;
  undefined7 extraout_var;
  int iVar8;
  uint uVar9;
  undefined4 in_register_00000034;
  QObject *object;
  long in_FS_OFFSET;
  _Optional_base<unsigned_long_long,_true,_true> _Var10;
  int flags;
  int status;
  QMetaType t;
  QMetaType local_a0;
  undefined4 local_98;
  int local_94;
  QByteArray local_90;
  QByteArray local_78;
  QMetaType local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined4 *puStack_40;
  long local_38;
  
  object = (QObject *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((object == (QObject *)0x0) || (pQVar5 = this->mobj, pQVar5 == (QMetaObject *)0x0)) ||
     (((this->data).d[2] & 2) == 0)) {
LAB_002883ca:
    sVar7 = 0;
  }
  else {
    puVar1 = (pQVar5->d).data;
    local_60.d_ptr =
         (pQVar5->d).metaTypes
         [(ulong)((int)((ulong)((long)(this->data).d - (long)puVar1) >> 2) - puVar1[7]) / 5];
    local_58.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QVariant>::metaType;
    bVar4 = ::comparesEqual(&local_60,(QMetaType *)&local_58);
    if (!bVar4) {
      local_78.d.d = (Data *)::QVariant::metaType((QVariant *)__buf);
      bVar4 = ::comparesEqual(&local_60,(QMetaType *)&local_78);
      if (!bVar4) {
        if ((((this->mobj != (QMetaObject *)0x0) && (((this->data).d[2] & 8) != 0)) &&
            ((pQVar5 = (this->menum).mobj, pQVar5 != (QMetaObject *)0x0 &&
             ((pQVar5->d).stringdata != (uint *)0x0)))) &&
           (((local_60.d_ptr == (QMetaTypeInterface *)0x0 ||
             ((local_60.d_ptr)->metaObjectFn == (MetaObjectFn)0x0)) ||
            (pQVar5 = (*(local_60.d_ptr)->metaObjectFn)(local_60.d_ptr),
            pQVar5 == (QMetaObject *)0x0)))) {
          local_58.shared = (PrivateShared *)::QVariant::metaType((QVariant *)__buf);
          local_78.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
          bVar4 = ::comparesEqual((QMetaType *)&local_58,(QMetaType *)&local_78);
          if (bVar4) {
            bVar4 = isFlagType(this);
            if (bVar4) {
              ::QVariant::toByteArray(&local_78,(QVariant *)__buf);
              if (local_78.d.ptr == (char *)0x0) {
                local_78.d.ptr = "";
              }
              _Var10._M_payload.super__Optional_payload_base<unsigned_long_long> =
                   (_Optional_payload<unsigned_long_long,_true,_true,_true>)
                   QMetaEnum::keysToValue64(&this->menum,local_78.d.ptr);
            }
            else {
              ::QVariant::toByteArray(&local_90,(QVariant *)__buf);
              if (local_90.d.ptr == (char *)0x0) {
                local_90.d.ptr = "";
              }
              _Var10._M_payload.super__Optional_payload_base<unsigned_long_long> =
                   (_Optional_payload<unsigned_long_long,_true,_true,_true>)
                   QMetaEnum::keyToValue64(&this->menum,local_90.d.ptr);
            }
            if (bVar4) {
              if ((QMetaTypeInterface *)local_78.d.d != (QMetaTypeInterface *)0x0) {
                LOCK();
                *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
                iVar8 = *(int *)local_78.d.d;
                UNLOCK();
                local_90.d.d = local_78.d.d;
joined_r0x00288580:
                if (iVar8 == 0) {
                  QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
                }
              }
            }
            else if ((QMetaTypeInterface *)local_90.d.d != (QMetaTypeInterface *)0x0) {
              LOCK();
              *(int *)local_90.d.d = *(int *)local_90.d.d + -1;
              iVar8 = *(int *)local_90.d.d;
              UNLOCK();
              goto joined_r0x00288580;
            }
            if (((undefined1  [16])
                 _Var10._M_payload.super__Optional_payload_base<unsigned_long_long> &
                (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              ::QVariant::QVariant
                        ((QVariant *)&local_58,
                         _Var10._M_payload.super__Optional_payload_base<unsigned_long_long>.
                         _M_payload);
              ::QVariant::operator=((QVariant *)__buf,(QVariant *)&local_58);
              ::QVariant::~QVariant((QVariant *)&local_58);
            }
          }
        }
        if (*(ulong *)((long)__buf + 0x18) < 4) {
          if ((this->mobj != (QMetaObject *)0x0) && (((this->data).d[2] & 4) != 0)) {
            bVar4 = reset(this,object);
            sVar7 = CONCAT71(extraout_var,bVar4);
            goto LAB_002883cc;
          }
          ::QVariant::QVariant((QVariant *)&local_58,local_60,(void *)0x0);
          ::QVariant::operator=((QVariant *)__buf,(QVariant *)&local_58);
          ::QVariant::~QVariant((QVariant *)&local_58);
        }
        else {
          bVar4 = ::QVariant::convert((QVariant *)__buf,local_60);
          if (!bVar4) goto LAB_002883ca;
        }
      }
    }
    local_58._16_8_ = &local_94;
    local_94 = -1;
    puStack_40 = &local_98;
    local_98 = 0;
    local_58.shared = (PrivateShared *)0x0;
    local_a0.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QVariant>::metaType;
    local_58._8_8_ = __buf;
    bVar4 = ::comparesEqual(&local_60,&local_a0);
    if (!bVar4) {
      __buf = ::QVariant::data((QVariant *)__buf);
    }
    pQVar5 = this->mobj;
    puVar1 = (pQVar5->d).data;
    local_58.shared = (PrivateShared *)__buf;
    if (((puVar1[0xc] & 4) == 0) ||
       (p_Var2 = (pQVar5->d).static_metacall, p_Var2 == (StaticMetacallFunction)0x0)) {
      iVar8 = 0;
      for (pQVar5 = (pQVar5->d).superdata.direct; pQVar5 != (QMetaObject *)0x0;
          pQVar5 = (pQVar5->d).superdata.direct) {
        iVar8 = iVar8 + (pQVar5->d).data[6];
      }
      uVar9 = iVar8 + ((int)((ulong)((long)(this->data).d - (long)puVar1) >> 2) - puVar1[7]) / 5;
      pQVar3 = ((object->d_ptr).d)->metaObject;
      if (pQVar3 == (QDynamicMetaObjectData *)0x0) {
        iVar8 = (*object->_vptr_QObject[2])(object,2,(ulong)uVar9,&local_58);
        uVar6 = CONCAT44(extraout_var_01,iVar8);
      }
      else {
        iVar8 = (*pQVar3->_vptr_QDynamicMetaObjectData[4])(pQVar3,object,2,(ulong)uVar9,&local_58);
        uVar6 = CONCAT44(extraout_var_00,iVar8);
      }
    }
    else {
      uVar6 = (*p_Var2)(object,WriteProperty,
                        ((int)((ulong)((long)(this->data).d - (long)puVar1) >> 2) - puVar1[7]) / 5,
                        &local_58.shared);
    }
    sVar7 = CONCAT71((int7)((ulong)uVar6 >> 8),local_94 != 0);
  }
LAB_002883cc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return sVar7;
}

Assistant:

bool QMetaProperty::write(QObject *object, QVariant &&v) const
{
    if (!object || !isWritable())
        return false;
    QMetaType t(mobj->d.metaTypes[data.index(mobj)]);
    if (t != QMetaType::fromType<QVariant>() && t != v.metaType()) {
        if (isEnumType() && !t.metaObject() && v.metaType() == QMetaType::fromType<QString>()) {
            // Assigning a string to a property of type Q_ENUMS (instead of Q_ENUM)
            // means the QMetaType has no associated QMetaObject, so it can't
            // do the conversion (see qmetatype.cpp:convertToEnum()).
            std::optional value = isFlagType() ? menum.keysToValue64(v.toByteArray())
                                               : menum.keyToValue64(v.toByteArray());
            if (value)
                v = QVariant(qlonglong(*value));

            // If the key(s)ToValue64 call failed, the convert() call below
            // gives QMetaType one last chance.
        }
        if (!v.isValid()) {
            if (isResettable())
                return reset(object);
            v = QVariant(t, nullptr);
        } else if (!v.convert(t)) {
            return false;
        }
    }
    // the status variable is changed by qt_metacall to indicate what it did
    // this feature is currently only used by Qt D-Bus and should not be depended
    // upon. Don't change it without looking into QDBusAbstractInterface first
    // -1 (unchanged): normal qt_metacall, result stored in argv[0]
    // changed: result stored directly in value, return the value of status
    int status = -1;
    // the flags variable is used by the declarative module to implement
    // interception of property writes.
    int flags = 0;
    void *argv[] = { nullptr, &v, &status, &flags };
    if (t == QMetaType::fromType<QVariant>())
        argv[0] = &v;
    else
        argv[0] = v.data();
    if (priv(mobj->d.data)->flags & PropertyAccessInStaticMetaCall && mobj->d.static_metacall)
        mobj->d.static_metacall(object, QMetaObject::WriteProperty, data.index(mobj), argv);
    else
        QMetaObject::metacall(object, QMetaObject::WriteProperty, data.index(mobj) + mobj->propertyOffset(), argv);

    return status;
}